

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O2

int __thiscall
Eigen::internal::SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseLUImpl<double,int> *this,Matrix<int,__1,_1,_0,__1,_1> *vec,int *length,int nbElts,
          int keep_prev,int *num_expansions)

{
  int iVar1;
  int iVar2;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> local_98;
  void *pvStack_68;
  Matrix<int,__1,_1,_0,__1,_1> old_vec;
  
  iVar1 = *length;
  iVar2 = iVar1;
  if ((keep_prev == 0) && (*num_expansions != 0)) {
    iVar2 = iVar1 + 1;
    if (iVar1 + 1 <= (int)((float)iVar1 * 1.5)) {
      iVar2 = (int)((float)iVar1 * 1.5);
    }
  }
  pvStack_68 = (void *)0x0;
  old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)0x0;
  old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (DenseIndex)(uint)nbElts;
  if (0 < nbElts) {
    VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_98,vec,0,
               old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    lazyAssign<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&pvStack_68,
               (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_98);
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)iVar2);
  if (0 < nbElts) {
    VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_98,vec,0,
               old_vec.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    DenseBase<Eigen::Block<Eigen::Matrix<int,-1,1,0,-1,1>,-1,1,false>>::
    lazyAssign<Eigen::Matrix<int,_1,1,0,_1,1>>
              ((DenseBase<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>> *)&local_98,
               (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&pvStack_68);
  }
  *length = iVar2;
  if (*num_expansions != 0) {
    *num_expansions = *num_expansions + 1;
  }
  free(pvStack_68);
  return 0;
}

Assistant:

Index  SparseLUImpl<Scalar,Index>::expand(VectorType& vec, Index& length, Index nbElts, Index keep_prev, Index& num_expansions) 
{
  
  float alpha = 1.5; // Ratio of the memory increase 
  Index new_len; // New size of the allocated memory
  
  if(num_expansions == 0 || keep_prev) 
    new_len = length ; // First time allocate requested
  else 
    new_len = (std::max)(length+1,Index(alpha * length));
  
  VectorType old_vec; // Temporary vector to hold the previous values   
  if (nbElts > 0 )
    old_vec = vec.segment(0,nbElts); 
  
  //Allocate or expand the current vector
#ifdef EIGEN_EXCEPTIONS
  try
#endif
  {
    vec.resize(new_len); 
  }
#ifdef EIGEN_EXCEPTIONS
  catch(std::bad_alloc& )
#else
  if(!vec.size())
#endif
  {
    if (!num_expansions)
    {
      // First time to allocate from LUMemInit()
      // Let LUMemInit() deals with it.
      return -1;
    }
    if (keep_prev)
    {
      // In this case, the memory length should not not be reduced
      return new_len;
    }
    else 
    {
      // Reduce the size and increase again 
      Index tries = 0; // Number of attempts
      do 
      {
        alpha = (alpha + 1)/2;
        new_len = (std::max)(length+1,Index(alpha * length));
#ifdef EIGEN_EXCEPTIONS
        try
#endif
        {
          vec.resize(new_len); 
        }
#ifdef EIGEN_EXCEPTIONS
        catch(std::bad_alloc& )
#else
        if (!vec.size())
#endif
        {
          tries += 1; 
          if ( tries > 10) return new_len; 
        }
      } while (!vec.size());
    }
  }
  //Copy the previous values to the newly allocated space 
  if (nbElts > 0)
    vec.segment(0, nbElts) = old_vec;   
   
  
  length  = new_len;
  if(num_expansions) ++num_expansions;
  return 0; 
}